

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trace.cpp
# Opt level: O2

void Al::internal::trace::save_trace_entry(string *entry,bool progress)

{
  undefined7 in_register_00000031;
  undefined1 *this;
  
  this = (anonymous_namespace)::trace_log_abi_cxx11_;
  if ((int)CONCAT71(in_register_00000031,progress) != 0) {
    this = (anonymous_namespace)::pe_trace_log_abi_cxx11_;
  }
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this,entry);
  return;
}

Assistant:

void save_trace_entry(std::string entry, bool progress) {
#ifdef AL_THREAD_MULTIPLE
  std::lock_guard<std::mutex> lock(log_mutex);
#endif
  if (progress) {
    pe_trace_log.push_back(std::move(entry));
  } else {
    trace_log.push_back(std::move(entry));
  }
}